

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O1

textblock * effect_describe(effect *e,char *prefix,int dev_skill_boost,_Bool only_first)

{
  ushort uVar1;
  ushort uVar2;
  dice_t *dice;
  random_value value_00;
  random_value value_01;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  effect *peVar7;
  char *pcVar8;
  char *pcVar9;
  textblock *ptVar10;
  obj_property *poVar11;
  textblock *tb;
  bool bVar12;
  int iVar13;
  wchar_t wVar14;
  undefined7 in_register_00000009;
  undefined8 uVar15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  effect *peVar20;
  textblock *tb_00;
  effect *effect;
  uint uVar21;
  random_value value_02;
  random_value value;
  random_value first_rv;
  char dice_string [20];
  char desc [250];
  random_value this_rv;
  char dice_string_1 [20];
  random_value local_2f8;
  uint local_2e0;
  undefined4 local_2dc;
  textblock *local_2d8;
  char *local_2d0;
  random_value local_2c8;
  char *local_2b8;
  wchar_t local_2b0;
  uint local_2ac;
  char *local_2a8;
  dice_t *local_2a0;
  effect local_298 [2];
  char local_218 [256];
  random_value local_118 [13];
  undefined1 local_48 [24];
  
  pcVar9 = (char *)CONCAT71(in_register_00000009,only_first);
  local_2dc = SUB84(pcVar9,0);
  local_2f8.base = 0;
  local_2f8.dice = 0;
  local_2f8.sides = 0;
  local_2f8.m_bonus = 0;
  if (e == (effect *)0x0) {
    tb = (textblock *)0x0;
  }
  else {
    tb = (textblock *)0x0;
    iVar19 = 0;
    bVar3 = false;
    local_2a8 = prefix;
    do {
      peVar7 = (effect *)effect_desc(e);
      if (e->index == 0x6d) {
        if (e->dice == (dice_t *)0x0) {
          __assert_fail("e->dice != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                        ,0x157,
                        "textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
                       );
        }
        dice_roll(e->dice,&local_2f8);
        e = e->next;
        bVar3 = true;
        goto LAB_00143169;
      }
      if (e->index == 0x6e) {
        if (!bVar3) {
          __assert_fail("value_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                        ,0x14f,
                        "textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
                       );
        }
        e = e->next;
        bVar3 = false;
        goto LAB_00143169;
      }
      iVar6 = 0;
      if ((e->dice != (dice_t *)0x0) && (iVar6 = 0, !bVar3)) {
        iVar6 = dice_roll(e->dice,&local_2f8);
      }
      uVar1 = e->index;
      if ((uVar1 == 0x6c) || (uVar1 == 1)) {
        pcVar8 = (char *)0x0;
        if (iVar19 == 0) {
          pcVar8 = prefix;
        }
        pcVar16 = (char *)0x0;
        if (uVar1 == 1) {
          pcVar16 = "randomly ";
        }
        peVar7 = e->next;
        local_2c8.base = 0;
        local_2c8.dice = 0;
        local_2c8.sides = 0;
        local_2c8.m_bonus = 0;
        pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),0 < iVar6 && peVar7 != (effect *)0x0);
        if (0 < iVar6 && peVar7 != (effect *)0x0) {
          local_2ac = (uint)uVar1;
          uVar21 = 2;
          peVar20 = peVar7;
          iVar17 = 1;
          local_2d0 = pcVar8;
          local_2b8 = pcVar16;
LAB_0014256a:
          pcVar8 = effect_desc(peVar20);
          if (((pcVar8 != (char *)0x0) && (uVar1 = peVar20->index, uVar1 != 0x6c)) && (uVar1 != 1))
          {
            local_2b0 = peVar20->other;
            dice = peVar20->dice;
            if (dice != (dice_t *)0x0) {
              dice_random_value(dice,&local_2c8);
            }
            peVar7 = peVar20->next;
            if (iVar17 < iVar6 && peVar7 != (effect *)0x0) {
              bVar5 = 1;
              iVar13 = 1;
              local_2d8 = (textblock *)(ulong)uVar21;
              local_2e0 = (uint)CONCAT71((uint7)(uint3)(uVar21 >> 8),1);
              bVar12 = true;
              local_2a0 = dice;
              do {
                pcVar9 = effect_desc(peVar7);
                if (((pcVar9 != (char *)0x0) && (uVar2 = peVar7->index, uVar2 != 1)) &&
                   (uVar2 != 0x6c)) {
                  iVar13 = iVar13 + 1;
                  if (uVar2 != uVar1) {
                    bVar12 = false;
                  }
                  local_2e0 = local_2e0 & 0xff;
                  if (peVar7->other != local_2b0) {
                    local_2e0 = 0;
                  }
                  if (peVar7->dice == (dice_t *)0x0) {
                    if (local_2a0 != (dice_t *)0x0) {
                      bVar5 = 0;
                    }
                  }
                  else if (local_2a0 == (dice_t *)0x0) {
                    bVar5 = 0;
                  }
                  else {
                    dice_random_value(peVar7->dice,local_118);
                    if (((local_118[0].base != local_2c8.base) ||
                        (local_118[0].dice != local_2c8.dice)) ||
                       ((local_118[0].sides != local_2c8.sides ||
                        (local_118[0].m_bonus != local_2c8.m_bonus)))) {
                      bVar5 = 0;
                    }
                  }
                }
                peVar7 = peVar7->next;
              } while ((peVar7 != (effect *)0x0) &&
                      (iVar18 = (int)local_2d8, local_2d8 = (textblock *)(ulong)(iVar18 + 1),
                      iVar18 < iVar6));
              bVar4 = (bool)(bVar5 ^ 1);
              bVar5 = (byte)local_2e0 ^ 1;
            }
            else {
              iVar13 = 1;
              bVar12 = true;
              bVar5 = 0;
              bVar4 = false;
            }
            if (((((uVar1 & 0xfffe) != 0x48) || (!bVar12)) || (bVar4)) || ((bVar5 & 1) != 0)) {
              uVar15 = 0;
              ptVar10 = effect_describe(peVar20,local_2b8,dev_skill_boost,true);
              pcVar9 = local_2d0;
              if (ptVar10 == (textblock *)0x0) {
                iVar13 = iVar13 + -1;
                tb_00 = (textblock *)0x0;
                iVar18 = 0;
              }
              else {
                tb_00 = ptVar10;
                if (local_2d0 != (char *)0x0) {
                  local_2d8 = textblock_new();
                  textblock_append(local_2d8,"%s",pcVar9);
                  tb_00 = local_2d8;
                  textblock_append_textblock(local_2d8,ptVar10);
                  textblock_free(ptVar10);
                }
                iVar18 = 1;
              }
              peVar20 = peVar20->next;
              pcVar9 = (char *)CONCAT71((int7)((ulong)uVar15 >> 8),
                                        iVar17 < iVar6 && peVar20 != (effect *)0x0);
              if (iVar17 < iVar6 && peVar20 != (effect *)0x0) {
                do {
                  pcVar9 = effect_desc(peVar20);
                  if (((pcVar9 != (char *)0x0) && (peVar20->index != 1)) && (peVar20->index != 0x6c)
                     ) {
                    pcVar9 = (char *)0x0;
                    if (iVar18 == 0) {
                      pcVar9 = local_2b8;
                    }
                    ptVar10 = effect_describe(peVar20,pcVar9,dev_skill_boost,true);
                    if (ptVar10 == (textblock *)0x0) {
                      iVar13 = iVar13 + -1;
                    }
                    else {
                      if ((local_2d0 != (char *)0x0) && (tb_00 == (textblock *)0x0)) {
                        if (iVar18 != 0) {
                          __assert_fail("ivalid == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                                        ,0x11e,
                                        "textblock *create_nested_effect_description(const struct effect *, int, const char *, const char *, int, const struct effect **)"
                                       );
                        }
                        tb_00 = textblock_new();
                        textblock_append(tb_00,"%s",local_2d0);
                      }
                      if (tb_00 != (textblock *)0x0) {
                        if (0 < iVar18) {
                          pcVar9 = ", ";
                          if (iVar18 == iVar13 + -1) {
                            pcVar9 = " or ";
                          }
                          textblock_append(tb_00,pcVar9);
                        }
                        textblock_append_textblock(tb_00,ptVar10);
                        textblock_free(ptVar10);
                        ptVar10 = tb_00;
                      }
                      iVar18 = iVar18 + 1;
                      tb_00 = ptVar10;
                    }
                  }
                  peVar20 = peVar20->next;
                  pcVar9 = (char *)peVar7;
                } while ((peVar20 != (effect *)0x0) &&
                        (bVar12 = (int)uVar21 < iVar6, uVar21 = uVar21 + 1, bVar12));
              }
            }
            else {
              pcVar9 = projections[peVar20->subtype].player_desc;
              strnfmt((char *)local_298,0x78,"%s",pcVar9);
              effect = peVar20->next;
              pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),
                                        iVar17 < iVar6 && effect != (effect *)0x0);
              if (iVar17 < iVar6 && effect != (effect *)0x0) {
                pcVar9 = (char *)(ulong)(iVar13 - 1U);
                local_2d8 = (textblock *)CONCAT44(local_2d8._4_4_,iVar13 - 1U);
                pcVar8 = " or ";
                if (2 < iVar13) {
                  pcVar8 = ", or ";
                }
                iVar17 = 1;
                do {
                  pcVar16 = effect_desc(effect);
                  if (((pcVar16 != (char *)0x0) && (effect->index != 1)) && (effect->index != 0x6c))
                  {
                    pcVar9 = ", ";
                    if (iVar17 == (int)local_2d8) {
                      pcVar9 = pcVar8;
                    }
                    my_strcat((char *)local_298,pcVar9,0x78);
                    pcVar9 = (char *)((long)effect->subtype * 0x68);
                    my_strcat((char *)local_298,projections[effect->subtype].player_desc,0x78);
                    iVar17 = iVar17 + 1;
                  }
                  effect = effect->next;
                } while ((effect != (effect *)0x0) &&
                        (bVar12 = (int)uVar21 < iVar6, uVar21 = uVar21 + 1, bVar12));
              }
              format_dice_string(&local_2c8,1,(size_t)local_48,pcVar9);
              pcVar9 = effect_desc(peVar20);
              strnfmt((char *)local_118,200,pcVar9,local_298,(ulong)(uint)peVar20->other,local_48);
              iVar6 = dev_skill_boost;
              if (peVar20->index == 0x48) {
                iVar6 = 0;
              }
              pcVar9 = (char *)CONCAT44(local_2c8.m_bonus,local_2c8.sides);
              value_01.dice = local_2c8.dice;
              value_01.base = local_2c8.base;
              value_01.sides = local_2c8.sides;
              value_01.m_bonus = local_2c8.m_bonus;
              append_damage((char *)local_118,200,value_01,iVar6);
              tb_00 = textblock_new();
              if (local_2d0 != (char *)0x0) {
                textblock_append(tb_00,"%s");
              }
              if ((short)local_2ac == 1) {
                textblock_append(tb_00,"%s",local_2b8);
              }
              copy_to_textblock_with_coloring(tb_00,(char *)local_118);
            }
            goto LAB_001425ae;
          }
          peVar7 = peVar20->next;
          if (peVar7 != (effect *)0x0) goto code_r0x00142596;
        }
        tb_00 = (textblock *)0x0;
LAB_001425ae:
        prefix = local_2a8;
        e = (effect *)0x0;
        if ((char)local_2dc == '\0') {
          e = peVar7;
        }
        if (tb_00 != (textblock *)0x0) {
          if (tb != (textblock *)0x0) {
            pcVar8 = ", ";
            if (e == (effect *)0x0) {
              pcVar8 = " and ";
            }
            textblock_append(tb,pcVar8);
            textblock_append_textblock(tb,tb_00);
            textblock_free(tb_00);
            tb_00 = tb;
          }
          tb = tb_00;
          iVar19 = iVar19 + 1;
        }
        goto LAB_00143169;
      }
      if (peVar7 == (effect *)0x0) {
        if ((char)local_2dc == '\0') {
          e = e->next;
        }
        else {
          e = (effect *)0x0;
        }
        goto LAB_00143169;
      }
      format_dice_string(&local_2f8,1,(size_t)local_298,pcVar9);
      iVar6 = dev_skill_boost;
      switch(base_descs[e->index].efinfo_flag) {
      case 0:
        pcVar9 = (char *)peVar7;
        peVar7 = (effect *)0x2795df;
        goto LAB_00142fa8;
      case 1:
        pcVar9 = (char *)local_298;
        goto LAB_00142fa8;
      case 2:
        if (local_2f8.m_bonus == 0) {
          strnfmt((char *)local_118,0x32,"%s","");
        }
        else {
          strnfmt((char *)local_118,0x32," (or %d%%, whichever is greater)");
        }
        pcVar9 = (char *)local_298;
        goto LAB_001430c2;
      case 3:
        wVar14 = local_2f8.base / 2;
        goto LAB_00142f35;
      case 4:
        pcVar9 = "leaves you nourished";
        if (e->subtype == L'\x01') {
          pcVar9 = "uses enough food value";
        }
        if (e->subtype == L'\0') {
          pcVar9 = "feeds you";
        }
        format_dice_string(&local_2f8,(uint)z_info->food_value,(size_t)local_118,
                           "uses enough food value");
        strnfmt(local_218,0xfa,(char *)peVar7,pcVar9,local_118,local_298);
        break;
      case 5:
        pcVar9 = timed_effects[e->subtype].desc;
        goto LAB_00142fa8;
      case 6:
        pcVar9 = timed_effects[e->subtype].desc;
        strnfmt(local_218,0xfa,(char *)peVar7,pcVar9,local_298);
        break;
      case 7:
        poVar11 = lookup_obj_property(1,e->subtype);
        pcVar9 = poVar11->name;
        goto LAB_00142fa8;
      case 8:
      case 0x11:
      case 0x13:
        pcVar9 = projections[e->subtype].desc;
        goto LAB_00142fa8;
      case 9:
        pcVar9 = summon_desc(e->subtype);
LAB_00142fa8:
        strnfmt(local_218,0xfa,(char *)peVar7);
        break;
      case 10:
        if (local_2f8.m_bonus == 0) {
          strnfmt((char *)local_118,0x20,"%d grids",(ulong)(uint)local_2f8.base);
        }
        else {
          strnfmt((char *)local_118,0x20,"a level-dependent distance");
        }
        pcVar9 = "a monster";
        if (e->subtype == L'\0') {
          pcVar9 = "you";
        }
LAB_001430c2:
        strnfmt(local_218,0xfa,(char *)peVar7,pcVar9,local_118);
        break;
      case 0xb:
        wVar14 = e->radius;
LAB_00142f35:
        pcVar9 = (char *)(ulong)(uint)wVar14;
        strnfmt(local_218,0xfa,(char *)peVar7);
        break;
      case 0xc:
        strnfmt(local_218,0xfa,(char *)peVar7,projections[e->subtype].player_desc,
                (ulong)(uint)e->radius,local_298);
        goto LAB_00143025;
      case 0xd:
        wVar14 = e->other;
        if (wVar14 == L'\0') {
          wVar14 = e->radius;
        }
        strnfmt(local_218,0xfa,(char *)peVar7,projections[e->subtype].player_desc,
                (ulong)(uint)e->radius,(ulong)(uint)wVar14,local_298);
        pcVar9 = (char *)CONCAT44(local_2f8.m_bonus,local_2f8.sides);
        value_00.dice = local_2f8.dice;
        value_00.base = local_2f8.base;
        value_00.sides = local_2f8.sides;
        value_00.m_bonus = local_2f8.m_bonus;
        append_damage(local_218,0xfa,value_00,dev_skill_boost);
        break;
      case 0xe:
        strnfmt(local_218,0xfa,(char *)peVar7,projections[e->subtype].player_desc,
                (ulong)(uint)e->other,local_298);
        if (e->index == 0x48) {
          iVar6 = 0;
        }
        uVar15 = CONCAT44(local_2f8.dice,local_2f8.base);
        pcVar9 = (char *)CONCAT44(local_2f8.m_bonus,local_2f8.sides);
        goto LAB_00143041;
      case 0xf:
        pcVar9 = projections[e->subtype].player_desc;
        if (e->other == L'\0') {
          iVar6 = 0;
        }
        else {
          iVar6 = (int)player->lev / e->other;
        }
        strnfmt(local_218,0xfa,(char *)peVar7,pcVar9,(ulong)(uint)(iVar6 + e->radius),local_298);
        break;
      case 0x10:
        pcVar9 = projections[e->subtype].lash_desc;
        strnfmt(local_218,0xfa,(char *)peVar7);
        break;
      case 0x12:
        strnfmt(local_218,0xfa,(char *)peVar7,projections[e->subtype].desc,local_298);
LAB_00143025:
        uVar15 = CONCAT44(local_2f8.dice,local_2f8.base);
        pcVar9 = (char *)CONCAT44(local_2f8.m_bonus,local_2f8.sides);
LAB_00143041:
        value_02._8_8_ = pcVar9;
        value_02.base = (int)uVar15;
        value_02.dice = (int)((ulong)uVar15 >> 0x20);
        append_damage(local_218,0xfa,value_02,iVar6);
        break;
      default:
        pcVar9 = "";
        strnfmt(local_218,0xfa,"%s");
        msg("Bad effect description passed to effect_info().  Please report this bug.");
      }
      if ((char)local_2dc == '\0') {
        e = e->next;
      }
      else {
        e = (effect *)0x0;
      }
      if (local_218[0] != '\0') {
        if (tb == (textblock *)0x0) {
          tb = textblock_new();
          if (prefix != (char *)0x0) {
            textblock_append(tb,"%s",prefix);
          }
        }
        else {
          if (e == (effect *)0x0) {
            pcVar8 = " and ";
          }
          else {
            pcVar8 = ", ";
          }
          textblock_append(tb,pcVar8);
        }
        copy_to_textblock_with_coloring(tb,local_218);
        iVar19 = iVar19 + 1;
      }
LAB_00143169:
    } while (e != (effect *)0x0);
  }
  return tb;
code_r0x00142596:
  uVar21 = uVar21 + 1;
  tb_00 = (textblock *)0x0;
  bVar12 = iVar6 <= iVar17;
  peVar20 = peVar7;
  iVar17 = iVar17 + 1;
  if (bVar12) goto LAB_001425ae;
  goto LAB_0014256a;
}

Assistant:

textblock *effect_describe(const struct effect *e, const char *prefix,
	int dev_skill_boost, bool only_first)
{
	textblock *tb = NULL;
	int nadded = 0;
	char desc[250];
	random_value value = { 0, 0, 0, 0 };
	bool value_set = false;

	while (e) {
		const char* edesc = effect_desc(e);
		int roll = 0;
		char dice_string[20];

		/* Deal with special clear value effect. */
		if (e->index == EF_CLEAR_VALUE) {
			assert(value_set);
			value_set = false;
			e = e->next;
			continue;
		}

		/* Deal with special set value effect. */
		if (e->index == EF_SET_VALUE) {
			assert(e->dice != NULL);
			roll = dice_roll(e->dice, &value);
			value_set = true;
			e = e->next;
			continue;
		}

		if ((e->dice != NULL) && !value_set) {
			roll = dice_roll(e->dice, &value);
		}

		/* Deal with special random or select effects. */
		if (e->index == EF_RANDOM || e->index == EF_SELECT) {
			const struct effect *nexte;
			textblock *tbe = create_nested_effect_description(
				e->next, roll, (nadded == 0) ? prefix : NULL,
				(e->index == EF_RANDOM) ? "randomly " : NULL,
				dev_skill_boost, &nexte);

			e = (only_first) ? NULL : nexte;
			if (tbe) {
				if (tb) {
					textblock_append(tb,
						e ? ", " : " and ");
					textblock_append_textblock(tb, tbe);
					textblock_free(tbe);
				} else {
					tb = tbe;
				}
				++nadded;
			}
			continue;
		}

		if (!edesc) {
			e = (only_first) ? NULL : e->next;
			continue;
		}

		format_dice_string(&value, 1, sizeof(dice_string), dice_string);

		/* Check all the possible types of description format. */
		switch (base_descs[e->index].efinfo_flag) {
		case EFINFO_DICE:
			strnfmt(desc, sizeof(desc), edesc, dice_string);
			break;

		case EFINFO_HEAL:
			/* Healing sometimes has a minimum percentage. */
			{
				char min_string[50];

				if (value.m_bonus) {
					strnfmt(min_string, sizeof(min_string),
						" (or %d%%, whichever is greater)",
						value.m_bonus);
				} else {
					strnfmt(min_string, sizeof(min_string),
						"%s", "");
				}
				strnfmt(desc, sizeof(desc), edesc, dice_string,
					min_string);
			}
			break;

		case EFINFO_CONST:
			strnfmt(desc, sizeof(desc), edesc, value.base / 2);
			break;

		case EFINFO_FOOD:
			{
				const char *fed = e->subtype ?
					(e->subtype == 1 ? "uses enough food value" : 
					 "leaves you nourished") : "feeds you";
				char turn_dice_string[20];

				format_dice_string(&value, z_info->food_value,
					sizeof(turn_dice_string),
					turn_dice_string);

				strnfmt(desc, sizeof(desc), edesc, fed,
					turn_dice_string, dice_string);
			}
			break;

		case EFINFO_CURE:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc);
			break;

		case EFINFO_TIMED:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc,
				dice_string);
			break;

		case EFINFO_STAT:
			{
				int stat = e->subtype;

				strnfmt(desc, sizeof(desc), edesc,
					lookup_obj_property(OBJ_PROPERTY_STAT, stat)->name);
			}
			break;

		case EFINFO_SEEN:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_SUMM:
			strnfmt(desc, sizeof(desc), edesc,
				summon_desc(e->subtype));
			break;

		case EFINFO_TELE:
			/*
			 * Only currently used for the player, but can handle
			 * monsters.
			 */
			{
				char dist[32];

				if (value.m_bonus) {
					strnfmt(dist, sizeof(dist),
						"a level-dependent distance");
				} else {
					strnfmt(dist, sizeof(dist),
						"%d grids", value.base);
				}
				strnfmt(desc, sizeof(desc), edesc,
					(e->subtype) ? "a monster" : "you",
					dist);
			}
			break;

		case EFINFO_QUAKE:
			strnfmt(desc, sizeof(desc), edesc, e->radius);
			break;

		case EFINFO_BALL:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_SPOT:
			{
				int i_radius = e->other ? e->other : e->radius;

				strnfmt(desc, sizeof(desc), edesc,
					projections[e->subtype].player_desc,
					e->radius, i_radius, dice_string);
				append_damage(desc, sizeof(desc), value, dev_skill_boost);
			}
			break;

		case EFINFO_BREATH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc, e->other,
				dice_string);
			append_damage(desc, sizeof(desc), value,
				e->index == EF_BREATH ? 0 : dev_skill_boost);
			break;

		case EFINFO_SHORT:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius +
					(e->other ? player->lev / e->other : 0),
				dice_string);
			break;

		case EFINFO_LASH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].lash_desc, e->subtype);
			break;

		case EFINFO_BOLT:
			/* Bolt that inflict status */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_BOLTD:
			/* Bolts and beams that damage */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_TOUCH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_NONE:
			strnfmt(desc, sizeof(desc), "%s", edesc);
			break;

		default:
			strnfmt(desc, sizeof(desc), "%s", "");
			msg("Bad effect description passed to effect_info().  Please report this bug.");
			break;
		}

		e = (only_first) ? NULL : e->next;

		if (desc[0] != '\0') {
			if (tb) {
				if (e) {
					textblock_append(tb, ", ");
				} else {
					textblock_append(tb, " and ");
				}
			} else {
				tb = textblock_new();
				if (prefix) {
					textblock_append(tb, "%s", prefix);
				}
			}
			copy_to_textblock_with_coloring(tb, desc);

			++nadded;
		}
	}

	return tb;
}